

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O3

Statement * __thiscall
rsg::ConditionalStatement::createNextChild(ConditionalStatement *this,GeneratorState *state)

{
  bool bVar1;
  deBool dVar2;
  Statement *pSVar3;
  VariableType *type;
  Expression *pEVar4;
  ExpressionGenerator generator;
  ValueRange range;
  ExpressionGenerator local_b0;
  ValueRange local_90;
  
  pSVar3 = this->m_trueStatement;
  if (this->m_falseStatement == (Statement *)0x0 && pSVar3 == (Statement *)0x0) {
    bVar1 = isElseBlockRequired(this,state);
    if (!bVar1) {
      dVar2 = deRandom_getBool(&state->m_random->m_rnd);
      if (dVar2 != 1) {
        pSVar3 = this->m_trueStatement;
        goto LAB_005a7a78;
      }
    }
    VariableManager::pushValueScope(state->m_varManager,&this->m_conditionalScope);
    pSVar3 = anon_unknown_0::createStatement(state);
    this->m_falseStatement = pSVar3;
  }
  else {
LAB_005a7a78:
    if (pSVar3 == (Statement *)0x0) {
      if (this->m_falseStatement != (Statement *)0x0) {
        VariableManager::popValueScope(state->m_varManager);
        ValueScope::clear(&this->m_conditionalScope);
      }
      VariableManager::pushValueScope(state->m_varManager,&this->m_conditionalScope);
      pSVar3 = anon_unknown_0::createStatement(state);
      this->m_trueStatement = pSVar3;
    }
    else {
      VariableManager::popValueScope(state->m_varManager);
      ValueScope::clear(&this->m_conditionalScope);
      ExpressionGenerator::ExpressionGenerator(&local_b0,state);
      type = VariableType::getScalarType(TYPE_BOOL);
      ValueRange::ValueRange(&local_90,type);
      if (local_90.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_90.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_90.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
      }
      (local_90.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
       super__Vector_impl_data._M_start)->boolVal = false;
      if (local_90.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_90.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_90.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
      }
      (local_90.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
       super__Vector_impl_data._M_start)->boolVal = true;
      pEVar4 = ExpressionGenerator::generate(&local_b0,&local_90,1);
      this->m_condition = pEVar4;
      ValueRange::~ValueRange(&local_90);
      ExpressionGenerator::~ExpressionGenerator(&local_b0);
      pSVar3 = (Statement *)0x0;
    }
  }
  return pSVar3;
}

Assistant:

Statement* ConditionalStatement::createNextChild (GeneratorState& state)
{
	// If has neither true or false statements, choose randomly whether to create false block.
	if (!m_falseStatement && !m_trueStatement && (isElseBlockRequired(state) || state.getRandom().getBool()))
	{
		// Construct false statement
		state.getVariableManager().pushValueScope(m_conditionalScope);
		m_falseStatement = createStatement(state);

		return m_falseStatement;
	}
	else if (!m_trueStatement)
	{
		if (m_falseStatement)
		{
			// Pop previous value scope.
			state.getVariableManager().popValueScope();
			m_conditionalScope.clear();
		}

		// Construct true statement
		state.getVariableManager().pushValueScope(m_conditionalScope);
		m_trueStatement = createStatement(state);

		return m_trueStatement;
	}
	else
	{
		// Pop conditional scope.
		state.getVariableManager().popValueScope();
		m_conditionalScope.clear();

		// Create condition
		DE_ASSERT(!m_condition);

		ExpressionGenerator generator(state);

		ValueRange range = ValueRange(VariableType::getScalarType(VariableType::TYPE_BOOL));
		range.getMin().asBool() = false;
		range.getMax().asBool() = true;

		m_condition = generator.generate(range, 1);

		return DE_NULL; // Done with this statement
	}
}